

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockTHUMB58HAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8 y;
  long lVar7;
  uint8 *puVar8;
  int iVar9;
  int iVar10;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  uint8 colorsRGB444 [2] [3];
  
  puVar8 = img + 3;
  if (channelsRGB == 3) {
    puVar8 = alpha;
  }
  colorsRGB444[0][0] = (byte)(block_part1 >> 0x16) & 0xf;
  colorsRGB444[0][1] = (byte)(block_part1 >> 0x12) & 0xf;
  colorsRGB444[0][2] = (byte)(block_part1 >> 0xe) & 0xf;
  colorsRGB444[1][0] = (byte)(block_part1 >> 10) & 0xf;
  colorsRGB444[1][1] = (byte)(block_part1 >> 6) & 0xf;
  colorsRGB444[1][2] = (byte)(block_part1 >> 2) & 0xf;
  decompressColor(4,4,4,colorsRGB444,colors);
  calculatePaintColors58H
            ((block_part1 >> 2 & 0xfff) <= (block_part1 >> 0xe & 0xfff) |
             (char)block_part1 * '\x02' & 6U,'\0',colors,paint_colors);
  iVar9 = starty * width + startx;
  iVar5 = channelsRGB * iVar9;
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar10 = iVar9;
    iVar6 = iVar5;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      uVar1 = iVar3 + (int)lVar7;
      uVar1 = (uint)((block_part2 >> (uVar1 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar1 & 0x1f | 0x10) & 1) * 2;
      img[iVar6] = paint_colors[uVar1][0];
      img[(long)iVar6 + 1] = paint_colors[uVar1][1];
      iVar4 = iVar10 << (channelsRGB != 3) * '\x02';
      img[(long)iVar6 + 2] = paint_colors[uVar1][2];
      if (uVar1 == 2) {
        puVar8[iVar4] = '\0';
        (img + iVar6)[0] = '\0';
        (img + iVar6)[1] = '\0';
        img[(long)iVar6 + 2] = '\0';
      }
      else {
        puVar8[iVar4] = 0xff;
      }
      iVar6 = iVar6 + channelsRGB * width;
      iVar10 = iVar10 + width;
    }
    iVar5 = iVar5 + channelsRGB;
    iVar9 = iVar9 + 1;
    iVar3 = iVar3 + 4;
  }
  return;
}

Assistant:

void decompressBlockTHUMB58HAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

  distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}